

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::Config::from_file(Config *this,string *name)

{
  byte bVar1;
  undefined8 uVar2;
  string *in_RDX;
  long *in_RSI;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_RDI;
  ifstream input;
  string *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined1 local_220 [544];
  
  ::std::ifstream::ifstream(local_220,in_RDX,_S_in);
  bVar1 = ::std::ios::good();
  if ((bVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    FileError::Missing(in_stack_fffffffffffffdc8);
    __cxa_throw(uVar2,&FileError::typeinfo,FileError::~FileError);
  }
  (**(code **)(*in_RSI + 8))(in_RDI,in_RSI,local_220);
  ::std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

std::vector<ConfigItem> from_file(const std::string &name) const {
        std::ifstream input{name};
        if(!input.good())
            throw FileError::Missing(name);

        return from_config(input);
    }